

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::file_error_alert::file_error_alert
          (file_error_alert *this,stack_allocator *alloc,error_code *ec,string_view f,
          operation_t op_,torrent_handle *h)

{
  error_category *peVar1;
  string_view str;
  bool bVar2;
  undefined3 uVar3;
  allocation_slot aVar4;
  char *pcVar5;
  string local_78;
  file_error_alert *local_48;
  char *pcStack_40;
  operation_t local_31;
  error_code *peStack_30;
  operation_t op__local;
  error_code *ec_local;
  stack_allocator *alloc_local;
  file_error_alert *this_local;
  string_view f_local;
  
  f_local.ptr_ = (char *)f.len_;
  this_local = (file_error_alert *)f.ptr_;
  local_31 = op_;
  peStack_30 = ec;
  ec_local = (error_code *)alloc;
  alloc_local = (stack_allocator *)this;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__file_error_alert_00991e08;
  bVar2 = peStack_30->failed_;
  uVar3 = *(undefined3 *)&peStack_30->field_0x5;
  peVar1 = peStack_30->cat_;
  (this->error).val_ = peStack_30->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  this->op = local_31;
  local_48 = this_local;
  pcStack_40 = f_local.ptr_;
  str.len_ = (size_t)f_local.ptr_;
  str.ptr_ = (char *)this_local;
  aVar4 = libtorrent::aux::stack_allocator::copy_string((stack_allocator *)ec_local,str);
  (this->m_file_idx).m_idx = aVar4.m_idx;
  pcVar5 = operation_name(local_31);
  this->operation = pcVar5;
  boost::basic_string_view::operator_cast_to_string(&this->file,(basic_string_view *)&this_local);
  boost::system::error_code::message_abi_cxx11_(&local_78,&this->error);
  convert_from_native(&this->msg,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

file_error_alert::file_error_alert(aux::stack_allocator& alloc
		, error_code const& ec, string_view f, operation_t const op_
		, torrent_handle const& h)
		: torrent_alert(alloc, h)
		, error(ec)
		, op(op_)
		, m_file_idx(alloc.copy_string(f))
#if TORRENT_ABI_VERSION == 1
		, operation(operation_name(op_))
		, file(f)
		, msg(convert_from_native(error.message()))
#endif
	{}